

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

void __thiscall Lexer::add_token_id(Lexer *this,TokenKind tokenKind)

{
  uchar *__first;
  size_type sVar1;
  TokenKind local_1c;
  unsigned_long local_18;
  unsigned_long local_10;
  
  sVar1 = (this->tok_id)._M_string_length;
  local_1c = tokenKind;
  if (sVar1 == 0) {
    sVar1 = 0;
  }
  else {
    __first = (uchar *)(this->tok_id)._M_dataplus._M_p;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&(this->data).ids,
               (const_iterator)
               (this->data).ids.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish,__first,__first + sVar1);
    sVar1 = (this->tok_id)._M_string_length;
  }
  local_18 = (long)(this->data).ids.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->data).ids.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  local_10 = local_18 - sVar1;
  std::vector<Token,std::allocator<Token>>::
  emplace_back<TokenKind&,TextPos_const&,unsigned_long,unsigned_long>
            ((vector<Token,std::allocator<Token>> *)&(this->data).tokens,&local_1c,
             &(this->reader).pos_,&local_10,&local_18);
  (this->tok_id)._M_string_length = 0;
  *(this->tok_id)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void Lexer::add_token_id(TokenKind tokenKind)
{
  if (!tok_id.empty())
    data.ids.insert(data.ids.end(),
                    (uint8_t*)&tok_id[0],
                    (uint8_t*)&tok_id[0]+tok_id.size());
  data.add_token(tokenKind,
                 reader.pos(),
                 data.ids.size()-tok_id.size(),
                 data.ids.size());
  tok_id.clear();
}